

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_nn_predict_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1664447::NnPredictTest_DISABLED_Speed_Test::TestBody
          (NnPredictTest_DISABLED_Speed_Test *this)

{
  uint uVar1;
  long lVar2;
  int64_t iVar3;
  int64_t iVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  undefined4 *puVar8;
  bool bVar9;
  aom_usec_timer local_740;
  NN_CONFIG nn_config;
  float outputs_ref [128];
  float outputs_test [128];
  float inputs [128];
  
  puVar8 = &DAT_00b5773c;
  for (lVar5 = 0; lVar5 != 0x11; lVar5 = lVar5 + 1) {
    memset(inputs,0,0x200);
    memset(outputs_test,0,0x200);
    memset(outputs_ref,0,0x200);
    memcpy(&nn_config,&(anonymous_namespace)::kShapes + lVar5 * 0x3a,0xe8);
    for (lVar2 = 5; lVar2 != 0xf; lVar2 = lVar2 + 1) {
      nn_config.weights[lVar2 + -5] = (this->super_NnPredictTest).weights[lVar2 + -5];
      nn_config.weights[lVar2 + 6] = (this->super_NnPredictTest).weights[lVar2 + 6];
    }
    ::aom_usec_timer_start(&local_740);
    iVar6 = 10000000;
    while (bVar9 = iVar6 != 0, iVar6 = iVar6 + -1, bVar9) {
      av1_nn_predict_c(inputs,&nn_config,0,outputs_ref);
    }
    ::aom_usec_timer_mark(&local_740);
    iVar3 = ::aom_usec_timer_elapsed(&local_740);
    ::aom_usec_timer_start(&local_740);
    iVar6 = 10000000;
    while (bVar9 = iVar6 != 0, iVar6 = iVar6 + -1, bVar9) {
      (*(this->super_NnPredictTest).target_func_)(inputs,&nn_config,0,outputs_test);
    }
    ::aom_usec_timer_mark(&local_740);
    iVar4 = ::aom_usec_timer_elapsed(&local_740);
    uVar1 = (&DAT_00b57738)[lVar5 * 0x3a];
    printf("%d",(ulong)(uint)(&(anonymous_namespace)::kShapes)[lVar5 * 0x3a]);
    if ((int)uVar1 < 1) {
      uVar1 = 0;
    }
    for (uVar7 = 0; uVar1 != uVar7; uVar7 = uVar7 + 1) {
      printf("x%d",(ulong)(uint)puVar8[uVar7]);
    }
    printf("x%d: ");
    printf("%7.2f/%7.2fns (%3.2f)\n",(double)iVar3,(double)iVar4,(double)iVar3 / (double)iVar4);
    puVar8 = puVar8 + 0x3a;
  }
  return;
}

Assistant:

TEST_P(NnPredictTest, DISABLED_Speed) {
  RunNnPredictSpeedTest_all(kShapes, sizeof(kShapes) / sizeof(kShapes[0]),
                            10000000);
}